

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v8::detail::dragonbox::divisible_by_power_of_5(uint32_t x,int exp)

{
  int in_ESI;
  int in_EDI;
  bool local_9;
  int local_8;
  int local_4;
  
  local_9 = in_ESI < 0xb;
  local_8 = in_ESI;
  local_4 = in_EDI;
  ignore_unused<bool,char[19]>(&local_9,(char (*) [19])"too large exponent");
  return local_4 * divisible_by_power_of_5::divtest_table[local_8].mod_inv <=
         divisible_by_power_of_5::divtest_table[local_8].max_quotient;
}

Assistant:

inline bool divisible_by_power_of_5(uint32_t x, int exp) FMT_NOEXCEPT {
  FMT_ASSERT(exp <= 10, "too large exponent");
  static constexpr const divtest_table_entry<uint32_t> divtest_table[] = {
      {0x00000001, 0xffffffff}, {0xcccccccd, 0x33333333},
      {0xc28f5c29, 0x0a3d70a3}, {0x26e978d5, 0x020c49ba},
      {0x3afb7e91, 0x0068db8b}, {0x0bcbe61d, 0x0014f8b5},
      {0x68c26139, 0x000431bd}, {0xae8d46a5, 0x0000d6bf},
      {0x22e90e21, 0x00002af3}, {0x3a2e9c6d, 0x00000897},
      {0x3ed61f49, 0x000001b7}};
  return x * divtest_table[exp].mod_inv <= divtest_table[exp].max_quotient;
}